

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O2

Orphan<capnp::DynamicList> * __thiscall
capnp::Orphan<capnp::DynamicValue>::releaseAs<capnp::DynamicList>
          (Orphan<capnp::DynamicList> *__return_storage_ptr__,Orphan<capnp::DynamicValue> *this)

{
  int64_t iVar1;
  anon_union_8_2_eba6ea51_for_Type_5 aVar2;
  Fault f;
  Fault local_10;
  
  if (this->type == LIST) {
    this->type = UNKNOWN;
    iVar1 = (this->field_1).intValue;
    aVar2 = *(anon_union_8_2_eba6ea51_for_Type_5 *)((long)&this->field_1 + 8);
    (__return_storage_ptr__->schema).elementType.baseType = (short)iVar1;
    (__return_storage_ptr__->schema).elementType.listDepth = (char)((ulong)iVar1 >> 0x10);
    (__return_storage_ptr__->schema).elementType.isImplicitParam =
         (bool)(char)((ulong)iVar1 >> 0x18);
    (__return_storage_ptr__->schema).elementType.field_3 =
         (anon_union_2_2_d12d5221_for_Type_3)(short)((ulong)iVar1 >> 0x20);
    *(short *)&(__return_storage_ptr__->schema).elementType.field_0x6 =
         (short)((ulong)iVar1 >> 0x30);
    (__return_storage_ptr__->schema).elementType.field_4 = aVar2;
    _::OrphanBuilder::OrphanBuilder(&__return_storage_ptr__->builder,&this->builder);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
             ,0x858,FAILED,"type == DynamicValue::LIST","\"Value type mismatch.\"",
             (char (*) [21])"Value type mismatch.");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

Orphan<DynamicList> Orphan<DynamicValue>::releaseAs<DynamicList>() {
  KJ_REQUIRE(type == DynamicValue::LIST, "Value type mismatch.");
  type = DynamicValue::UNKNOWN;
  return Orphan<DynamicList>(listSchema, kj::mv(builder));
}